

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

ImportInfo * __thiscall cmGeneratorTarget::GetImportInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  ImportInfo *pIVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_bool>
  pVar4;
  string config_upper;
  ImportInfo info;
  value_type entry;
  key_type local_270;
  ImportInfo local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
  local_148;
  
  if (this->Target->IsImportedTarget == true) {
    paVar1 = &local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    local_270._M_dataplus._M_p = (pointer)paVar1;
    if (config->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_270,0,(char *)0x0,0x640706);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_148.first,config);
      std::__cxx11::string::operator=((string *)&local_270,(string *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
        operator_delete(local_148.first._M_dataplus._M_p,
                        local_148.first.field_2._M_allocated_capacity + 1);
      }
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
            ::find(&(this->ImportInfoMap)._M_t,&local_270);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      local_250.Location._M_dataplus._M_p = (pointer)&local_250.Location.field_2;
      local_250.NoSOName = false;
      local_250.Multiplicity = 0;
      local_250.Location._M_string_length = 0;
      local_250.Location.field_2._M_local_buf[0] = '\0';
      local_250.SOName._M_dataplus._M_p = (pointer)&local_250.SOName.field_2;
      local_250.SOName._M_string_length = 0;
      local_250.SOName.field_2._M_local_buf[0] = '\0';
      local_250.ImportLibrary._M_dataplus._M_p = (pointer)&local_250.ImportLibrary.field_2;
      local_250.ImportLibrary._M_string_length = 0;
      local_250.ImportLibrary.field_2._M_local_buf[0] = '\0';
      local_250.LibName._M_dataplus._M_p = (pointer)&local_250.LibName.field_2;
      local_250.LibName._M_string_length = 0;
      local_250.LibName.field_2._M_local_buf[0] = '\0';
      local_250.Languages._M_dataplus._M_p = (pointer)&local_250.Languages.field_2;
      local_250.Languages._M_string_length = 0;
      local_250.Languages.field_2._M_local_buf[0] = '\0';
      local_250.Libraries._M_dataplus._M_p = (pointer)&local_250.Libraries.field_2;
      local_250.Libraries._M_string_length = 0;
      local_250.Libraries.field_2._M_local_buf[0] = '\0';
      local_250.LibrariesProp._M_dataplus._M_p = (pointer)&local_250.LibrariesProp.field_2;
      local_250.LibrariesProp._M_string_length = 0;
      local_250.LibrariesProp.field_2._M_local_buf[0] = '\0';
      local_250.SharedDeps._M_dataplus._M_p = (pointer)&local_250.SharedDeps.field_2;
      local_250.SharedDeps._M_string_length = 0;
      local_250.SharedDeps.field_2._M_local_buf[0] = '\0';
      ComputeImportInfo(this,&local_270,&local_250);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ImportInfo_&,_true>
                (&local_148,&local_270,&local_250);
      pVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
              ::
              _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
                          *)&this->ImportInfoMap,&local_148);
      iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
      ImportInfo::~ImportInfo(&local_148.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
        operator_delete(local_148.first._M_dataplus._M_p,
                        local_148.first.field_2._M_allocated_capacity + 1);
      }
      ImportInfo::~ImportInfo(&local_250);
    }
    if (((this->Target->TargetTypeValue == INTERFACE_LIBRARY) ||
        (iVar2._M_node[2]._M_left != (_Base_ptr)0x0)) ||
       (iVar2._M_node[4]._M_left != (_Base_ptr)0x0)) {
      pIVar3 = (ImportInfo *)(iVar2._M_node + 2);
    }
    else {
      pIVar3 = (ImportInfo *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,
                      CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                               local_270.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    pIVar3 = (ImportInfo *)0x0;
  }
  return pIVar3;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}